

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O1

hrgls_Status hrgls_MessageSetValue(hrgls_Message obj,char *val)

{
  char *pcVar1;
  hrgls_Status hVar2;
  
  if (obj == (hrgls_Message)0x0) {
    hVar2 = 0x3ee;
  }
  else if (val == (char *)0x0) {
    hVar2 = 0x3e9;
  }
  else {
    pcVar1 = (char *)(obj->value)._M_string_length;
    strlen(val);
    hVar2 = 0;
    std::__cxx11::string::_M_replace((ulong)obj,0,pcVar1,(ulong)val);
  }
  return hVar2;
}

Assistant:

HRGLS_EXPORT hrgls_Status hrgls_MessageSetValue(hrgls_Message obj, const char *val)
  {
	  hrgls_Status s = hrgls_STATUS_OKAY;
	  if (!obj) {
		  return hrgls_STATUS_NULL_OBJECT_POINTER;
	  }
	  if (!val) {
		  return hrgls_STATUS_BAD_PARAMETER;
	  }
	  obj->value = val;
	  return s;
  }